

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertySkipSpaces(Scl_Tree_t *p,char **ppPos,char *pEnd,int fStopAtNewLine)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  
  pbVar1 = (byte *)*ppPos;
  pbVar2 = pbVar1;
  if (pEnd <= pbVar1) {
LAB_0045e78a:
    *ppPos = (char *)pbVar2;
    return (int)(pbVar2 == (byte *)pEnd);
  }
  do {
    bVar3 = *pbVar1;
    pbVar2 = pbVar1;
    if (bVar3 == 10) {
      p->nLines = p->nLines + 1;
      if (fStopAtNewLine != 0) goto LAB_0045e78a;
      bVar3 = *pbVar1;
    }
    if ((((0x20 < bVar3) || ((0x100002600U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) && (bVar3 != 0x5c))
       || (pbVar1 = pbVar1 + 1, pbVar2 = (byte *)pEnd, pbVar1 == (byte *)pEnd)) goto LAB_0045e78a;
  } while( true );
}

Assistant:

static inline int Scl_LibertySkipSpaces( Scl_Tree_t * p, char ** ppPos, char * pEnd, int fStopAtNewLine )
{
    char * pPos = *ppPos;
    for ( ; pPos < pEnd; pPos++ )
    {
        if ( *pPos == '\n' )
        {
            p->nLines++;
            if ( fStopAtNewLine )
                break;
        }        
        if ( !Scl_LibertyCharIsSpace(*pPos) )
            break;
    }
    *ppPos = pPos;
    return pPos == pEnd;
}